

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLcode Curl_output_digest(Curl_easy *data,_Bool proxy,uchar *request,uchar *uripath)

{
  char *pcVar1;
  size_t urilen;
  auth *authp;
  digestdata *digest;
  char *passwdp;
  char *userp;
  char **allocuserpwd;
  _Bool have_chlg;
  size_t len;
  char *response;
  char *tmp;
  uchar *path;
  uchar *puStack_30;
  CURLcode result;
  uchar *uripath_local;
  uchar *request_local;
  Curl_easy *pCStack_18;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  tmp = (char *)0x0;
  response = (char *)0x0;
  if (proxy) {
    authp = (auth *)&(data->state).proxydigest;
    userp = (char *)&(data->state).aptr;
    passwdp = (data->state).aptr.proxyuser;
    digest = (digestdata *)(data->state).aptr.proxypasswd;
    urilen = (size_t)&(data->state).authproxy;
  }
  else {
    authp = (auth *)&(data->state).digest;
    userp = (char *)&(data->state).aptr.userpwd;
    passwdp = (data->state).aptr.user;
    digest = (digestdata *)(data->state).aptr.passwd;
    urilen = (size_t)&(data->state).authhost;
  }
  puStack_30 = uripath;
  uripath_local = request;
  request_local._7_1_ = proxy;
  pCStack_18 = data;
  (*Curl_cfree)(*(void **)userp);
  userp[0] = '\0';
  userp[1] = '\0';
  userp[2] = '\0';
  userp[3] = '\0';
  userp[4] = '\0';
  userp[5] = '\0';
  userp[6] = '\0';
  userp[7] = '\0';
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  if (digest == (digestdata *)0x0) {
    digest = (digestdata *)0x1c158d;
  }
  if (authp->want == 0) {
    *(byte *)(urilen + 0x18) = *(byte *)(urilen + 0x18) & 0xfe;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if (((*(byte *)(urilen + 0x18) >> 2 & 1) != 0) &&
       (response = strchr((char *)puStack_30,0x3f), response != (char *)0x0)) {
      tmp = curl_maprintf("%.*s",(long)response - (long)puStack_30 & 0xffffffff,puStack_30);
    }
    if (response == (char *)0x0) {
      tmp = (*Curl_cstrdup)((char *)puStack_30);
    }
    if (tmp == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      path._4_4_ = Curl_auth_create_digest_http_message
                             (pCStack_18,passwdp,(char *)digest,uripath_local,(uchar *)tmp,
                              (digestdata *)authp,(char **)&len,(size_t *)&stack0xffffffffffffffa8);
      (*Curl_cfree)(tmp);
      if (path._4_4_ == CURLE_OK) {
        pcVar1 = "";
        if ((request_local._7_1_ & 1) != 0) {
          pcVar1 = "Proxy-";
        }
        pcVar1 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar1,len);
        *(char **)userp = pcVar1;
        (*Curl_cfree)((void *)len);
        if (*(long *)userp == 0) {
          data_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          *(byte *)(urilen + 0x18) = *(byte *)(urilen + 0x18) & 0xfe | 1;
          data_local._4_4_ = CURLE_OK;
        }
      }
      else {
        data_local._4_4_ = path._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_output_digest(struct Curl_easy *data,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for an HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
#ifdef CURL_DISABLE_PROXY
    return CURLE_NOT_BUILT_IN;
#else
    digest = &data->state.proxydigest;
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    authp = &data->state.authproxy;
#endif
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      /* typecast is fine here since the value is always less than 32 bits */
      path = (unsigned char *) aprintf("%.*s", (int)urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}